

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall tl::Vector<LoadedImage>::grow(Vector<LoadedImage> *this,size_t capacity)

{
  size_t capacity_00;
  
  if (capacity < 0x41) {
    capacity_00 = 0x40;
  }
  else {
    capacity_00 = 0x100;
    if (0x100 < capacity) {
      capacity_00 = nextPowerOf2(capacity);
    }
  }
  reserve(this,capacity_00);
  return;
}

Assistant:

void Vector<T>::grow(size_t capacity)noexcept
{
    if(capacity <= 64) {
        reserve(64);
    }
    else if(capacity <= 256) {
        reserve(256);
    }
    else {
       const size_t n = nextPowerOf2(capacity);
       reserve(n);
    }
}